

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlapGraph.cpp
# Opt level: O3

int __thiscall dgrminer::OverlapGraph::computeSupport(OverlapGraph *this)

{
  _Rb_tree_node_base *__k;
  iterator iVar1;
  pointer piVar2;
  OverlapGraph *pOVar3;
  pointer piVar4;
  int iVar5;
  vector<int,std::allocator<int>> *pvVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  long lVar10;
  int result;
  vector<int,_std::allocator<int>_> max_clique_data;
  CGraphIO gio;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  nodeList;
  _Rb_tree_color local_124;
  OverlapGraph *local_120;
  undefined1 local_118 [8];
  pointer piStack_110;
  _Base_ptr local_108;
  _Rb_tree_node_base *local_100;
  _Rb_tree_node_base *local_f8;
  size_t local_f0;
  _Rb_tree_header *local_e8;
  _Rb_tree_node_base *local_e0;
  undefined1 local_d8 [72];
  pointer local_90;
  pointer piStack_88;
  pointer local_80;
  pointer pdStack_78;
  pointer local_70;
  pointer pdStack_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  local_d8._0_8_ = &PTR__CGraphIO_00140d80;
  local_d8._24_8_ = (pointer)0x0;
  local_d8._32_8_ = (int *)0x0;
  local_d8._40_8_ = (int *)0x0;
  local_d8._48_8_ = (pointer)0x0;
  local_d8._56_8_ = (pointer)0x0;
  local_d8._64_8_ = (pointer)0x0;
  local_90 = (pointer)0x0;
  piStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  pdStack_78 = (pointer)0x0;
  local_70 = (pointer)0x0;
  pdStack_68 = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            ((vector<int,_std::allocator<int>_> *)(local_d8 + 0x18),(iterator)0x0,(int *)local_118);
  p_Var8 = (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e0 = &(this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120 = this;
  if (p_Var8 != local_e0) {
    local_e8 = &(this->vertices)._M_t._M_impl.super__Rb_tree_header;
    do {
      piStack_110 = (pointer)((ulong)piStack_110 & 0xffffffff00000000);
      local_108 = (_Base_ptr)0x0;
      local_f0 = 0;
      local_100 = (_Rb_tree_node_base *)&piStack_110;
      local_f8 = (_Rb_tree_node_base *)&piStack_110;
      std::
      __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((local_120->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,local_e8
                 ,*(undefined8 *)(p_Var8 + 2),&p_Var8[1]._M_left,local_118,
                 (_Rb_tree_node_base *)&piStack_110);
      if (local_100 != (_Rb_tree_node_base *)&piStack_110) {
        __k = p_Var8 + 1;
        p_Var7 = local_100;
        do {
          local_124 = p_Var7[1]._M_color;
          if ((int)local_124 < (int)__k->_M_color) {
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)&local_60,(key_type *)__k);
            iVar1._M_current = *(int **)(pvVar6 + 8);
            if (iVar1._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar1,(int *)&local_124);
            }
            else {
              *iVar1._M_current = local_124;
              *(int **)(pvVar6 + 8) = iVar1._M_current + 1;
            }
            pvVar6 = (vector<int,std::allocator<int>> *)
                     std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   *)&local_60,(key_type *)&local_124);
            iVar1._M_current = *(int **)(pvVar6 + 8);
            if (iVar1._M_current == *(int **)(pvVar6 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar6,iVar1,(int *)__k);
            }
            else {
              *iVar1._M_current = __k->_M_color;
              *(int **)(pvVar6 + 8) = iVar1._M_current + 1;
            }
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != (_Rb_tree_node_base *)&piStack_110);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_118);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_e0);
  }
  local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
  if ((local_120->vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      piVar4 = piStack_88;
      pmVar9 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&local_60,(key_type *)local_118);
      piVar2 = (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pmVar9 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&local_60,(key_type *)local_118);
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&local_90,piVar4,piVar2,
                 (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      local_124 = (_Rb_tree_color)((ulong)((long)piStack_88 - (long)local_90) >> 2);
      if (local_d8._32_8_ == local_d8._40_8_) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(local_d8 + 0x18),(iterator)local_d8._32_8_,
                   (int *)&local_124);
      }
      else {
        *(_Rb_tree_color *)local_d8._32_8_ = local_124;
        local_d8._32_8_ = local_d8._32_8_ + 4;
      }
      lVar10 = (long)(int)local_118._0_4_;
      local_118._0_4_ = (int)(lVar10 + 1U);
    } while (lVar10 + 1U < (local_120->vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pOVar3 = local_120;
  CGraphIO::CalculateVertexDegrees((CGraphIO *)local_d8);
  if (pOVar3->heuristic == true) {
    iVar5 = maxCliqueHeu((CGraphIO *)local_d8);
  }
  else {
    local_118 = (undefined1  [8])0x0;
    piStack_110 = (pointer)0x0;
    local_108 = (_Base_ptr)0x0;
    iVar5 = maxClique((CGraphIO *)local_d8,0,(vector<int,_std::allocator<int>_> *)local_118);
    if (local_118 != (undefined1  [8])0x0) {
      operator_delete((void *)local_118);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  CGraphIO::~CGraphIO((CGraphIO *)local_d8);
  return iVar5;
}

Assistant:

int OverlapGraph::computeSupport() {
		// create inverse graph and calculate maximum clique
		CGraphIO gio;
	  	map<int,vector<int> > nodeList;

		gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());

		for (auto const &adjacencyList : adjacencyLists) {
		  	std::set<int> inverseResult;

		  	std::set_difference(
		  		vertices.begin(),
			    vertices.end(),
			    adjacencyList.second.begin(),
			    adjacencyList.second.end(),
			    std::inserter(inverseResult, inverseResult.end())
		  	);

		  	for (auto result : inverseResult) {
			  	if (result < adjacencyList.first) {
				  	nodeList[adjacencyList.first].push_back(result);
				  	nodeList[result].push_back(adjacencyList.first);
			  	}
		  	}
		}

	  	for(int i=0; i < vertices.size(); ++i) {
		  	gio.m_vi_Edges.insert(gio.m_vi_Edges.end(),nodeList[i].begin(),nodeList[i].end());
		  	gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());
		}

		gio.CalculateVertexDegrees();

		if (heuristic){
		  	return maxCliqueHeu(gio);
		}

		std::vector<int> max_clique_data;
		return maxClique(gio, 0, max_clique_data);
	}